

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Group_Type.cxx
# Opt level: O2

void __thiscall Fluid_Table::Fluid_Table(Fluid_Table *this,int x,int y,int w,int h,char *l)

{
  int (*paiVar1) [7];
  int iVar2;
  long lVar3;
  long lVar4;
  
  Fl_Table::Fl_Table(&this->super_Fl_Table,x,y,w,h,l);
  (this->super_Fl_Table).super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget =
       (_func_int **)&PTR__Fl_Table_00271d18;
  paiVar1 = this->data;
  iVar2 = 1000;
  for (lVar3 = 0; lVar3 != 0xe; lVar3 = lVar3 + 1) {
    for (lVar4 = 0; lVar4 != 7; lVar4 = lVar4 + 1) {
      (*paiVar1)[lVar4] = iVar2 + (int)lVar4;
    }
    iVar2 = iVar2 + 1000;
    paiVar1 = paiVar1 + 1;
  }
  Fl_Table::rows(&this->super_Fl_Table,0xe);
  Fl_Table::row_header(&this->super_Fl_Table,1);
  Fl_Table::row_height_all(&this->super_Fl_Table,0x14);
  (this->super_Fl_Table)._row_resize = '\0';
  (*(this->super_Fl_Table).super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget[0xd])(this,7);
  Fl_Table::col_header(&this->super_Fl_Table,1);
  Fl_Table::col_width_all(&this->super_Fl_Table,0x50);
  (this->super_Fl_Table)._col_resize = '\x01';
  return;
}

Assistant:

Fluid_Table(int x, int y, int w, int h, const char *l=0L)
  : Fl_Table(x, y, w, h, l) {
    for ( int r=0; r<MAX_ROWS; r++ )
      for ( int c=0; c<MAX_COLS; c++ )
        data[r][c] = 1000+(r*1000)+c;
    // Rows
    rows(MAX_ROWS);             // how many rows
    row_header(1);              // enable row headers (along left)
    row_height_all(20);         // default height of rows
    row_resize(0);              // disable row resizing                                // Cols
    cols(MAX_COLS);             // how many columns
    col_header(1);              // enable column headers (along top)
    col_width_all(80);          // default width of columns
    col_resize(1);              // enable column resizing
  }